

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_FindMatchingFont(uchar *font_collection,char *name_utf8,stbtt_int32 flags)

{
  bool bVar1;
  uint in_EAX;
  uint fontstart;
  int iVar2;
  stbtt_uint32 sVar3;
  size_t sVar4;
  stbtt_int32 next_id;
  int index;
  stbtt_int32 nlen;
  
  index = 0;
  do {
    fontstart = stbtt_GetFontOffsetForIndex(font_collection,index);
    if ((int)fontstart < 0) {
      bVar1 = false;
      in_EAX = fontstart;
    }
    else {
      sVar4 = strlen(name_utf8);
      iVar2 = stbtt__isfont(font_collection + fontstart);
      bVar1 = true;
      if (iVar2 != 0) {
        if (flags != 0) {
          sVar3 = stbtt__find_table(font_collection,fontstart,"head");
          if ((flags & 7U) != (font_collection[(ulong)sVar3 + 0x2d] & 7)) goto LAB_0010b2e6;
        }
        sVar3 = stbtt__find_table(font_collection,fontstart,"name");
        if (sVar3 != 0) {
          nlen = (stbtt_int32)sVar4;
          if (flags == 0) {
            iVar2 = stbtt__matchpair(font_collection,sVar3,(stbtt_uint8 *)name_utf8,nlen,0x10,0x11);
            if (iVar2 == 0) {
              next_id = 2;
              goto LAB_0010b2d7;
            }
          }
          else {
            iVar2 = stbtt__matchpair(font_collection,sVar3,(stbtt_uint8 *)name_utf8,nlen,0x10,-1);
            if (iVar2 == 0) {
              next_id = -1;
LAB_0010b2d7:
              iVar2 = stbtt__matchpair(font_collection,sVar3,(stbtt_uint8 *)name_utf8,nlen,1,next_id
                                      );
              if (iVar2 == 0) {
                iVar2 = stbtt__matchpair(font_collection,sVar3,(stbtt_uint8 *)name_utf8,nlen,3,-1);
                if (iVar2 != 0) {
                  bVar1 = false;
                }
                goto LAB_0010b2e6;
              }
            }
          }
          bVar1 = false;
        }
      }
LAB_0010b2e6:
      if (!bVar1) {
        in_EAX = fontstart;
      }
    }
    index = index + 1;
    if (!bVar1) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

STBTT_DEF int stbtt_FindMatchingFont(const unsigned char *font_collection, const char *name_utf8, stbtt_int32 flags)
{
   stbtt_int32 i;
   for (i=0;;++i) {
      stbtt_int32 off = stbtt_GetFontOffsetForIndex(font_collection, i);
      if (off < 0) return off;
      if (stbtt__matches((stbtt_uint8 *) font_collection, off, (stbtt_uint8*) name_utf8, flags))
         return off;
   }
}